

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

void Spl_ManLutFanouts_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vFanouts,Vec_Bit_t *vMarksNo,Vec_Bit_t *vMarksCIO)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  if ((-1 < iObj) && (iObj < vMarksNo->nSize)) {
    uVar6 = (uint)iObj >> 5;
    uVar5 = iObj & 0x1f;
    if (((uint)vMarksNo->pArray[uVar6] >> uVar5 & 1) == 0) {
      if (vMarksCIO->nSize <= iObj) goto LAB_007c1900;
      uVar1 = vMarksCIO->pArray[uVar6];
      if ((uVar1 >> uVar5 & 1) == 0) {
        if (p->vMapping2->nSize <= iObj) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (p->vMapping2->pArray[(uint)iObj].nSize != 0) {
          vMarksCIO->pArray[uVar6] = uVar1 | 1 << uVar5;
          Vec_IntPush(vFanouts,iObj);
          return;
        }
        pVVar4 = p->vFanoutNums;
        if (iObj < pVVar4->nSize) {
          iVar7 = 0;
          while( true ) {
            if (pVVar4->pArray[(uint)iObj] <= iVar7) {
              return;
            }
            iVar2 = p->vFanout->nSize;
            if (iVar2 <= iObj) break;
            piVar3 = p->vFanout->pArray;
            uVar6 = piVar3[(uint)iObj] + iVar7;
            if (((int)uVar6 < 0) || (iVar2 <= (int)uVar6)) break;
            Spl_ManLutFanouts_rec(p,piVar3[uVar6],vFanouts,vMarksNo,vMarksCIO);
            iVar7 = iVar7 + 1;
            pVVar4 = p->vFanoutNums;
            if (pVVar4->nSize <= iObj) break;
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
    }
    return;
  }
LAB_007c1900:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
}

Assistant:

void Spl_ManLutFanouts_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vFanouts, Vec_Bit_t * vMarksNo, Vec_Bit_t * vMarksCIO )
{
    int iFanout, i;
    if ( Vec_BitEntry(vMarksNo, iObj) || Vec_BitEntry(vMarksCIO, iObj) )
        return;
    if ( Gia_ObjIsLut2(p, iObj) )
    {
        Vec_BitWriteEntry( vMarksCIO, iObj, 1 );
        Vec_IntPush( vFanouts, iObj );
        return;
    }
    Gia_ObjForEachFanoutStaticId( p, iObj, iFanout, i )
        Spl_ManLutFanouts_rec( p, iFanout, vFanouts, vMarksNo, vMarksCIO );
}